

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::lts_20250127::debugging_internal::ParseQRequiresClauseExpr(State *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  undefined1 uVar5;
  uint uVar6;
  uint uVar8;
  ParseState *pPVar7;
  
  iVar1 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar1 + 1;
  state->steps = iVar2 + 1;
  uVar5 = 0xff < iVar1;
  if (0x1ffff < iVar2 || (bool)uVar5) goto LAB_0106eab8;
  iVar1 = (state->parse_state).prev_name_idx;
  iVar2 = (state->parse_state).mangled_idx;
  iVar3 = (state->parse_state).out_cur_idx;
  uVar8 = *(uint *)&(state->parse_state).field_0xc;
  *(uint *)&(state->parse_state).field_0xc = uVar8 & 0x7fffffff;
  bVar4 = ParseOneCharToken(state,'Q');
  if (bVar4) {
    bVar4 = ParseExpression(state);
    if (!bVar4) goto LAB_0106eaa2;
    uVar6 = *(uint *)&(state->parse_state).field_0xc & 0x7fffffff;
    pPVar7 = (ParseState *)(ulong)uVar6;
    uVar8 = uVar8 & 0x80000000 | uVar6;
  }
  else {
LAB_0106eaa2:
    pPVar7 = &state->parse_state;
    (state->parse_state).prev_name_idx = iVar1;
    pPVar7->mangled_idx = iVar2;
    pPVar7->out_cur_idx = iVar3;
  }
  uVar5 = SUB81(pPVar7,0);
  *(uint *)&(state->parse_state).field_0xc = uVar8;
LAB_0106eab8:
  state->recursion_depth = state->recursion_depth + -1;
  return (bool)uVar5;
}

Assistant:

static bool ParseQRequiresClauseExpr(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  DisableAppend(state);

  // <requires-clause expr> is just an <expression>: http://shortn/_9E1Ul0rIM8
  if (ParseOneCharToken(state, 'Q') && ParseExpression(state)) {
    RestoreAppend(state, copy.append);
    return true;
  }

  // also restores append
  state->parse_state = copy;
  return false;
}